

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivy.h
# Opt level: O1

Ivy_Obj_t * Ivy_ObjCreatePo(Ivy_Man_t *p,Ivy_Obj_t *pDriver)

{
  Ivy_Obj_t *pIVar1;
  
  if ((Ivy_Obj_t *)0x1 < pDriver) {
    *(uint *)&(p->Ghost).field_0x8 = *(uint *)&(p->Ghost).field_0x8 & 0xfffff9f0 | 2;
    (p->Ghost).pFanin0 = pDriver;
    (p->Ghost).pFanin1 = (Ivy_Obj_t *)0x0;
    pIVar1 = Ivy_ObjCreate(p,&p->Ghost);
    return pIVar1;
  }
  __assert_fail("Type == IVY_PI || Ivy_Regular(p0) != Ivy_Regular(p1)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivy.h"
                ,0x139,
                "Ivy_Obj_t *Ivy_ObjCreateGhost(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *, Ivy_Type_t, Ivy_Init_t)"
               );
}

Assistant:

static inline Ivy_Obj_t *  Ivy_ObjCreateGhost( Ivy_Man_t * p, Ivy_Obj_t * p0, Ivy_Obj_t * p1, Ivy_Type_t Type, Ivy_Init_t Init )    
{
    Ivy_Obj_t * pGhost, * pTemp;
    assert( Type != IVY_AND || !Ivy_ObjIsConst1(Ivy_Regular(p0)) );
    assert( p1 == NULL || !Ivy_ObjIsConst1(Ivy_Regular(p1)) );
    assert( Type == IVY_PI || Ivy_Regular(p0) != Ivy_Regular(p1) );
    assert( Type != IVY_LATCH || !Ivy_IsComplement(p0) );
//    assert( p1 == NULL || (!Ivy_ObjIsLatch(Ivy_Regular(p0)) || !Ivy_ObjIsLatch(Ivy_Regular(p1))) );
    pGhost = Ivy_ManGhost(p);
    pGhost->Type = Type;
    pGhost->Init = Init;
    pGhost->pFanin0 = p0;
    pGhost->pFanin1 = p1;
    if ( p1 && Ivy_ObjFaninId0(pGhost) > Ivy_ObjFaninId1(pGhost) )
        pTemp = pGhost->pFanin0, pGhost->pFanin0 = pGhost->pFanin1, pGhost->pFanin1 = pTemp;
    return pGhost;
}